

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O2

void cluster_preprocess(int n,vec3f *positions,int *clusterids,SphereTree *hierarchy,int *sphcnt)

{
  pointer pfVar1;
  data_t dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined1 auVar6 [8];
  pointer pfVar7;
  float *pfVar8;
  iterator __begin1;
  ulong uVar9;
  float *data;
  float *pfVar10;
  undefined8 *puVar11;
  long lVar12;
  int iVar13;
  vec3f *b;
  undefined1 *__s;
  int iVar14;
  float *pfVar15;
  ulong uVar16;
  float *pfVar17;
  int k;
  uint uVar18;
  int recv;
  ulong uVar19;
  long lVar20;
  float fVar21;
  vec3f vVar22;
  undefined8 uStack_100;
  ulong auStack_f8 [2];
  undefined1 local_e8 [8];
  vector<int,_std::allocator<int>_> recv_cnt;
  vector<vec3f,_std::allocator<vec3f>_> recv_sum;
  undefined1 local_a0 [8];
  vector<float,_std::allocator<float>_> cluster_radius;
  vector<float,_std::allocator<float>_> cluster_blocker_count;
  vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  blockers;
  int local_44;
  int *local_40;
  float *local_38;
  
  auStack_f8[1] = 0x156031;
  local_40 = clusterids;
  github111116::ConsoleLogger::log<char[26]>(&console,(char (*) [26])"per-cluster processing...");
  uVar9 = 0;
  local_38 = (float *)(ulong)(uint)n;
  if (n < 1) {
    local_38 = (float *)uVar9;
  }
  uVar18 = 0;
  for (; local_38 != (float *)uVar9; uVar9 = uVar9 + 1) {
    if ((int)uVar18 <= local_40[uVar9]) {
      uVar18 = local_40[uVar9];
    }
  }
  uVar9 = (ulong)(uVar18 + 1);
  recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  auStack_f8[1] = 0x15607e;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e8,uVar9,
             (value_type_conflict5 *)
             &recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,(allocator_type *)local_a0);
  local_a0 = (undefined1  [8])0x0;
  cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  auStack_f8[1] = 0x1560a0;
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)
             &recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,uVar9,(value_type *)local_a0,
             (allocator_type *)
             &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  b = positions;
  for (uVar19 = 0; local_38 != (float *)uVar19; uVar19 = uVar19 + 1) {
    iVar13 = local_40[uVar19];
    *(int *)((long)local_e8 + (long)iVar13 * 4) = *(int *)((long)local_e8 + (long)iVar13 * 4) + 1;
    auStack_f8[1] = 0x1560d1;
    operator+=((vec3f *)((long)iVar13 * 0xc +
                        CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_,
                                 recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._0_4_)),b);
    b = b + 1;
  }
  lVar12 = uVar9 * 0xc;
  lVar5 = -(lVar12 + 0xfU & 0xfffffffffffffff0);
  __s = local_e8 + lVar5;
  lVar20 = 0;
  *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0xc;
  uVar19 = *(ulong *)((long)auStack_f8 + lVar5 + 8);
  *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x15611d;
  memset(__s,0,lVar12 - (lVar12 - 0xcU) % uVar19);
  for (uVar19 = 0; uVar19 <= uVar18; uVar19 = uVar19 + 1) {
    lVar12 = CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_,
                      recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_);
    iVar13 = *(int *)((long)local_e8 + uVar19 * 4);
    *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156149;
    vVar22 = operator/((vec3f *)(lVar12 + lVar20),(float)iVar13);
    *(long *)(__s + lVar20) = vVar22._0_8_;
    *(data_t *)((long)&recv_cnt + lVar20 + lVar5) = vVar22.z;
    if (*(int *)((long)local_e8 + uVar19 * 4) == 0) {
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156176;
      github111116::ConsoleLogger::debug<char[36]>
                (&console,(char (*) [36])"encountering empty receiver cluster");
      *(undefined8 *)(__s + lVar20) = 0;
      *(undefined4 *)((long)&recv_cnt + lVar20 + lVar5) = 0;
    }
    lVar20 = lVar20 + 0xc;
  }
  cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x1561a8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a0,uVar9,
             (value_type *)
             &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (allocator_type *)
             &cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  for (uVar19 = 0; pfVar8 = local_38, auVar6 = local_a0, local_38 != (float *)uVar19;
      uVar19 = uVar19 + 1) {
    lVar12 = (long)local_40[uVar19];
    *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x1561d2;
    vVar22 = operator-(positions,(vec3f *)(__s + lVar12 * 0xc));
    fVar21 = SQRT(vVar22.z * vVar22.z + vVar22.x * vVar22.x + vVar22.y * vVar22.y);
    if (fVar21 <= *(float *)((long)auVar6 + lVar12 * 4)) {
      fVar21 = *(float *)((long)auVar6 + lVar12 * 4);
    }
    *(float *)((long)local_a0 + lVar12 * 4) = fVar21;
    positions = positions + 1;
  }
  *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156216;
  local_38 = (float *)operator_new__(0x1000000);
  *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156228;
  data = (float *)operator_new__(0x3c00000);
  cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156242;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,uVar9,
             (value_type *)
             &cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(allocator_type *)&local_44);
  uVar9 = 0;
  pfVar10 = data;
  while( true ) {
    if (uVar18 < uVar9) {
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x15634a;
      (*glad_glActiveTexture)(0x84c4);
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 4;
      pfVar10 = local_38;
      uVar3 = *(undefined8 *)((long)auStack_f8 + lVar5 + 8);
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156369;
      create_2D_float_texture(0x400,0x400,(int)uVar3,pfVar10,0x2600,false);
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156370;
      (*glad_glActiveTexture)(0x84c5);
      *(undefined8 *)((long)auStack_f8 + lVar5) = 1;
      uVar3 = *(undefined8 *)((long)auStack_f8 + lVar5);
      *(undefined8 *)((long)auStack_f8 + lVar5) = 0xf;
      uVar4 = *(undefined8 *)((long)auStack_f8 + lVar5);
      *(undefined8 *)((long)auStack_f8 + lVar5) = 0;
      *(undefined8 *)((long)&uStack_100 + lVar5) = 0x156394;
      create_2D_float_texture_array
                (0x400,0x400,(int)uVar3,(int)uVar4,data,0x2600,*(bool *)((long)auStack_f8 + lVar5));
      pfVar10 = local_38;
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x15639f;
      operator_delete__(pfVar10);
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x1563a7;
      operator_delete__(data);
      pfVar10 = (float *)CONCAT44(cluster_radius.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                  cluster_radius.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      for (uVar9 = 0; pfVar8 != (float *)uVar9; uVar9 = uVar9 + 1) {
        sphcnt[uVar9] = (int)pfVar10[local_40[uVar9]];
      }
      local_44 = 0;
      iVar13 = 0;
      for (; pfVar10 !=
             cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start; pfVar10 = pfVar10 + 1) {
        iVar14 = (int)*pfVar10;
        iVar13 = iVar13 + iVar14;
        if (local_44 <= iVar14) {
          local_44 = iVar14;
        }
      }
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156409;
      github111116::ConsoleLogger::log<char[27],int>
                (&console,(char (*) [27])"max #blockers per cluster:",&local_44);
      cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((double)((iVar13 * 10) / (int)(uVar18 + 1)) * 0.1);
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156437;
      github111116::ConsoleLogger::log<char[27],double>
                (&console,(char (*) [27])"avg #blockers per cluster:",
                 (double *)
                 &cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156440;
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)
                 &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x15644c;
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)local_a0);
      auStack_f8[1] = 0x15645f;
      std::_Vector_base<vec3f,_std::allocator<vec3f>_>::~_Vector_base
                ((_Vector_base<vec3f,_std::allocator<vec3f>_> *)
                 &recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      auStack_f8[1] = 0x15646b;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_e8);
      return;
    }
    uVar3 = *(undefined8 *)(__s + uVar9 * 0xc);
    dVar2 = *(data_t *)((long)&recv_cnt + uVar9 * 0xc + lVar5);
    fVar21 = *(float *)((long)local_a0 + uVar9 * 4);
    *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x15628e;
    vVar22.z = dVar2;
    vVar22._0_8_ = uVar3;
    treecut_ratio((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   *)&cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,hierarchy,vVar22,fVar21,
                  (anonymous_namespace)::theta_max,(anonymous_namespace)::theta_min);
    pfVar7 = cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    lVar20 = (long)blockers.
                   super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start -
             (long)cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x28;
    lVar12 = *(long *)((long)auStack_f8 + lVar5 + 8);
    uVar19 = lVar20 / lVar12;
    if ((0x3ff < uVar9) || (0x400 < uVar19)) break;
    pfVar15 = pfVar10;
    for (uVar16 = 0; uVar16 != uVar19; uVar16 = uVar16 + 1) {
      pfVar1 = pfVar7 + uVar16 * 10;
      uVar3 = *(undefined8 *)(pfVar1 + 2);
      *(undefined8 *)(local_38 + uVar9 * 0x1000 + uVar16 * 4) = *(undefined8 *)pfVar1;
      *(undefined8 *)(local_38 + uVar9 * 0x1000 + uVar16 * 4 + 2) = uVar3;
      lVar12 = *(long *)(pfVar7 + uVar16 * 10 + 4);
      pfVar17 = pfVar15;
      for (lVar20 = 0; lVar20 != 0xf; lVar20 = lVar20 + 1) {
        *pfVar17 = *(float *)(lVar12 + lVar20 * 4);
        pfVar17 = pfVar17 + 0x100000;
      }
      pfVar15 = pfVar15 + 1;
    }
    *(float *)(CONCAT44(cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_,
                        cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._0_4_) + uVar9 * 4) =
         (float)(long)uVar19;
    *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x15632d;
    std::
    vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::~vector((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
               *)&cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    uVar9 = uVar9 + 1;
    pfVar10 = pfVar10 + 0x400;
  }
  *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 8;
  uVar3 = *(undefined8 *)((long)auStack_f8 + lVar5 + 8);
  *(undefined8 *)((long)auStack_f8 + lVar5 + 8) = 0x156482;
  puVar11 = (undefined8 *)__cxa_allocate_exception(uVar3,lVar12,lVar20 % lVar12);
  *puVar11 = "sphere texture overflowing";
  *(undefined1 **)((long)auStack_f8 + lVar5 + 8) = &LAB_0015649d;
  __cxa_throw(puVar11,&char_const*::typeinfo,0);
}

Assistant:

void cluster_preprocess(int n, const vec3f* positions, const int* clusterids, const SphereTree& hierarchy, int* sphcnt)
{
	console.log("per-cluster processing...");
	// calculate number of clusters
	int maxcluster = 0;
	for (int recv=0; recv<n; ++recv)
		maxcluster = std::max(maxcluster, clusterids[recv]);
	int n_cluster = maxcluster+1;
	// calculate centers of clusters (average over all receivers)
	std::vector<int> recv_cnt(n_cluster,0);
	std::vector<vec3f> recv_sum(n_cluster,0);
	for (int recv=0; recv<n; ++recv) {
		int c = clusterids[recv];
		recv_cnt[c] += 1;
		recv_sum[c] += positions[recv];
	}
	vec3f cluster_center[n_cluster];
	for (int c=0; c<n_cluster; ++c) {
		cluster_center[c] = recv_sum[c] / recv_cnt[c];
		if (recv_cnt[c] == 0) {
			console.debug("encountering empty receiver cluster");
			cluster_center[c] = vec3f(0,0,0);
		}
	}
	// calculate bounding radius of clusters
	std::vector<float> cluster_radius(n_cluster,0);
	for (int recv=0; recv<n; ++recv) {
		int c = clusterids[recv];
		cluster_radius[c] = std::max(cluster_radius[c], norm(positions[recv] - cluster_center[c]));
	}
	// prepare texture data
	static const int texwidth = 1024; // max number of spheres per cluster
	static const int texheight = 1024; // max number of cluster
	float* sphdata = new float[texheight * texwidth * 4];
	float* ratiodata = new float[shorder * texheight * texwidth];
	// assemble bounding sphere nodes for shading each cluster
	std::vector<float> cluster_blocker_count(n_cluster,0);
	for (int c=0; c<n_cluster; ++c) {
		// assemble blockers & calculate ratio vectors
		std::vector<std::pair<Sphere, std::vector<float>>> blockers
			= treecut_ratio(hierarchy, cluster_center[c], cluster_radius[c], theta_max, theta_min);
		if (blockers.size() > texwidth || c >= texheight)
			throw "sphere texture overflowing";
		// store into texture data
		for (int i=0; i<blockers.size(); ++i) {
			memcpy(sphdata + c*texwidth*4 + i*4, &blockers[i].first, sizeof(Sphere));
			for (int k=0; k<shorder; ++k)
				ratiodata[(k * texheight + c) * texwidth + i] = blockers[i].second[k];
		}
		cluster_blocker_count[c] = blockers.size();
	}
	// build texture
	glActiveTexture(GL_TEXTURE4);
	create_2D_float_texture(texwidth, texheight, 4, sphdata, GL_NEAREST);
	glActiveTexture(GL_TEXTURE5);
	create_2D_float_texture_array(texwidth, texheight, 1, shorder, ratiodata, GL_NEAREST);
	delete[] sphdata;
	delete[] ratiodata;
	// assign sphere count of each vertex
	for (int recv=0; recv<n; ++recv)
		sphcnt[recv] = cluster_blocker_count[clusterids[recv]];
	// show stats
	int s = 0, max = 0;
	for (int t: cluster_blocker_count) {
		s += t;
		max = std::max(max, t);
	}
	console.log("max #blockers per cluster:", max);
	console.log("avg #blockers per cluster:", 10 * s / n_cluster * 0.1);
}